

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# some_types.h
# Opt level: O1

void hiberlite::hibernate<hiberlite::AVisitor<hiberlite::KillChildren>,std::pair<int,double>>
               (AVisitor<hiberlite::KillChildren> *ar,
               set<std::pair<int,_double>,_std::less<std::pair<int,_double>_>,_std::allocator<std::pair<int,_double>_>_>
               *m,uint param_3)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Base_ptr p_Var2;
  undefined1 *local_d0;
  long local_c8;
  undefined1 local_c0 [16];
  set<std::pair<int,_double>,_std::less<std::pair<int,_double>_>,_std::allocator<std::pair<int,_double>_>_>
  *local_b0;
  _Base_ptr p_Stack_a8;
  int local_a0;
  undefined4 uStack_9c;
  double dStack_98;
  undefined1 *local_90;
  long local_88;
  undefined1 local_80 [16];
  collection_nvp<std::pair<int,_double>,_hiberlite::stl_stream_adapter<std::pair<int,_double>,_std::set<std::pair<int,_double>,_std::less<std::pair<int,_double>_>,_std::allocator<std::pair<int,_double>_>_>_>_>
  local_70;
  
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"items","");
  p_Var2 = (m->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char*>((string *)&local_d0,local_90,local_90 + local_88);
  local_a0 = 0;
  dStack_98 = 0.0;
  local_b0 = m;
  p_Stack_a8 = p_Var2;
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  paVar1 = &local_70.name.field_2;
  local_70.name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_d0,local_d0 + local_c8);
  local_70.stream.xx._4_4_ = uStack_9c;
  local_70.stream.xx.first = local_a0;
  local_70.stream.xx.second = dStack_98;
  local_70.stream.ct = local_b0;
  local_70.stream.it._M_node = p_Stack_a8;
  AVisitor<hiberlite::KillChildren>::operator&(ar,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_70.name._M_dataplus._M_p);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  return;
}

Assistant:

void hibernate(A& ar, std::set<Key>& m, const unsigned int)
{
	typedef Key ElType;
	collection_nvp<ElType,stl_stream_adapter<ElType,std::set<Key> > >
			body( "items", stl_stream_adapter<ElType,std::set<Key> >(m) );
	ar & body;
}